

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListAppendSignalEvent
          (ze_command_list_handle_t hCommandList,ze_event_handle_t hEvent)

{
  ze_pfnCommandListAppendSignalEvent_t pfnAppendSignalEvent;
  dditable_t *dditable;
  ze_result_t result;
  ze_event_handle_t hEvent_local;
  ze_command_list_handle_t hCommandList_local;
  
  if (*(code **)(*(long *)(hCommandList + 8) + 0x2a0) == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hCommandList_local._4_4_ =
         (**(code **)(*(long *)(hCommandList + 8) + 0x2a0))
                   (*(undefined8 *)hCommandList,*(undefined8 *)hEvent);
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendSignalEvent(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendSignalEvent = dditable->ze.CommandList.pfnAppendSignalEvent;
        if( nullptr == pfnAppendSignalEvent )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hEvent = reinterpret_cast<ze_event_object_t*>( hEvent )->handle;

        // forward to device-driver
        result = pfnAppendSignalEvent( hCommandList, hEvent );

        return result;
    }